

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_declarator(CPState *cp,CPDecl *decl)

{
  int iVar1;
  CTSize CVar2;
  CPState *in_RSI;
  CPState *in_RDI;
  CPDeclIdx pos;
  CTInfo info;
  CTSize sz;
  CPDecl *in_stack_00000690;
  CPState *in_stack_00000698;
  CTSize in_stack_ffffffffffffffd8;
  ErrMsg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  CPToken in_stack_ffffffffffffffe4;
  int in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  iVar1 = in_RDI->depth + 1;
  in_RDI->depth = iVar1;
  if (0x14 < iVar1) {
    cp_err((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffdc);
  }
  while( true ) {
    while (iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
                         ), iVar1 != 0) {
      cp_decl_attributes((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffec = 8;
      in_stack_ffffffffffffffe8 = 0x20030000;
      if (((in_RSI->sb).e.ptr32 >> 8 & 0xff) == 4) {
        in_stack_ffffffffffffffec = 4;
        in_stack_ffffffffffffffe8 = 0x20020000;
      }
      in_stack_ffffffffffffffe8 = ((in_RSI->sb).e.ptr32 & 0x3800000) + in_stack_ffffffffffffffe8;
      (in_RSI->sb).e.ptr32 = (in_RSI->sb).e.ptr32 & 0xfcff00ff;
      cp_push((CPDecl *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    }
    iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if ((iVar1 == 0) &&
       (iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0),
       iVar1 == 0)) break;
    (in_RSI->sb).e.ptr32 = (in_RSI->sb).e.ptr32 & 0xfcff00ff;
    cp_push((CPDecl *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
            in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  }
  iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
  if (iVar1 == 0) {
    if (in_RDI->tok == 0x100) {
      if (((in_RSI->val).id & 4) == 0) {
        cp_err_token((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc);
      }
      in_RSI->ct = (CType *)in_RDI->str;
      (in_RSI->sb).p.ptr32 = (in_RDI->val).id;
      cp_next((CPState *)0x1ad3ef);
    }
    else if (((in_RSI->val).id & 2) == 0) {
      cp_err_token((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                   in_stack_ffffffffffffffdc);
    }
  }
  else {
    cp_decl_attributes((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    if (((in_RSI->val).id & 2) != 0) {
      if (in_RDI->tok == 0x29) goto LAB_001ad451;
      iVar1 = cp_istypedecl(in_RDI);
      if (iVar1 != 0) goto LAB_001ad451;
    }
    in_stack_ffffffffffffffe4 = in_RSI->tok;
    cp_declarator(in_RSI,(CPDecl *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    cp_check((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc);
    in_RSI->tok = in_stack_ffffffffffffffe4;
  }
  while( true ) {
    while (iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0
                         ), iVar1 != 0) {
      cp_decl_array((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    }
    iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0);
    if (iVar1 == 0) break;
LAB_001ad451:
    cp_decl_func(in_stack_00000698,in_stack_00000690);
  }
  if ((((in_RSI->val).id & 8) != 0) &&
     (iVar1 = cp_opt((CPState *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),0),
     iVar1 != 0)) {
    CVar2 = cp_expr_ksize((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    *(CTSize *)((long)&in_RSI->L + 4) = CVar2;
  }
  cp_decl_attributes((CPState *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (CPDecl *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  cp_push_attributes((CPDecl *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  in_RDI->depth = in_RDI->depth + -1;
  return;
}

Assistant:

static void cp_declarator(CPState *cp, CPDecl *decl)
{
  if (++cp->depth > CPARSE_MAX_DECLDEPTH) cp_err(cp, LJ_ERR_XLEVELS);

  for (;;) {  /* Head of declarator. */
    if (cp_opt(cp, '*')) {  /* Pointer. */
      CTSize sz;
      CTInfo info;
      cp_decl_attributes(cp, decl);
      sz = CTSIZE_PTR;
      info = CTINFO(CT_PTR, CTALIGN_PTR);
#if LJ_64
      if (ctype_msizeP(decl->attr) == 4) {
	sz = 4;
	info = CTINFO(CT_PTR, CTALIGN(2));
      }
#endif
      info += (decl->attr & (CTF_QUAL|CTF_REF));
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, info, sz);
    } else if (cp_opt(cp, '&') || cp_opt(cp, CTOK_ANDAND)) {  /* Reference. */
      decl->attr &= ~(CTF_QUAL|(CTMASK_MSIZEP<<CTSHIFT_MSIZEP));
      cp_push(decl, CTINFO_REF(0), CTSIZE_PTR);
    } else {
      break;
    }
  }

  if (cp_opt(cp, '(')) {  /* Inner declarator. */
    CPDeclIdx pos;
    cp_decl_attributes(cp, decl);
    /* Resolve ambiguity between inner declarator and 1st function parameter. */
    if ((decl->mode & CPARSE_MODE_ABSTRACT) &&
	(cp->tok == ')' || cp_istypedecl(cp))) goto func_decl;
    pos = decl->pos;
    cp_declarator(cp, decl);
    cp_check(cp, ')');
    decl->pos = pos;
  } else if (cp->tok == CTOK_IDENT) {  /* Direct declarator. */
    if (!(decl->mode & CPARSE_MODE_DIRECT)) cp_err_token(cp, CTOK_EOF);
    decl->name = cp->str;
    decl->nameid = cp->val.id;
    cp_next(cp);
  } else {  /* Abstract declarator. */
    if (!(decl->mode & CPARSE_MODE_ABSTRACT)) cp_err_token(cp, CTOK_IDENT);
  }

  for (;;) {  /* Tail of declarator. */
    if (cp_opt(cp, '[')) {  /* Array. */
      cp_decl_array(cp, decl);
    } else if (cp_opt(cp, '(')) {  /* Function. */
    func_decl:
      cp_decl_func(cp, decl);
    } else {
      break;
    }
  }

  if ((decl->mode & CPARSE_MODE_FIELD) && cp_opt(cp, ':'))  /* Field width. */
    decl->bits = cp_expr_ksize(cp);

  /* Process postfix attributes. */
  cp_decl_attributes(cp, decl);
  cp_push_attributes(decl);

  cp->depth--;
}